

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_FindEnumTypeByName_Test::
FileDescriptorTest_FindEnumTypeByName_Test(FileDescriptorTest_FindEnumTypeByName_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FileDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FileDescriptorTest_01881e50;
  DescriptorPool::DescriptorPool(&(this->super_FileDescriptorTest).pool_);
  (this->super_FileDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__FileDescriptorTest_01876970;
  return;
}

Assistant:

TEST_F(FileDescriptorTest, FindEnumTypeByName) {
  EXPECT_EQ(foo_enum_, foo_file_->FindEnumTypeByName("FooEnum"));
  EXPECT_EQ(bar_enum_, bar_file_->FindEnumTypeByName("BarEnum"));

  EXPECT_TRUE(foo_file_->FindEnumTypeByName("BarEnum") == nullptr);
  EXPECT_TRUE(bar_file_->FindEnumTypeByName("FooEnum") == nullptr);
  EXPECT_TRUE(baz_file_->FindEnumTypeByName("FooEnum") == nullptr);

  EXPECT_TRUE(foo_file_->FindEnumTypeByName("NoSuchEnum") == nullptr);
  EXPECT_TRUE(foo_file_->FindEnumTypeByName("FooMessage") == nullptr);
}